

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

ExprP<float> __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::ApplyReflect<1,_float,_float,_float>::apply
          (ApplyReflect<1,_float,_float,_float> *this,ExpandContext *param_1,ExprP<float> *i,
          ExprP<float> *n)

{
  SharedPtrStateBase *extraout_RDX;
  ExprP<float> EVar1;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_110;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_100;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_f0;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_e0;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_d0;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_c0;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_b0;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_a0;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_90;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_80;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_70;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_60;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_50;
  float local_3c;
  float local_38;
  float local_34;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_30;
  
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_30,n,i);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_80,n,(ExprP<float> *)&local_30);
  local_34 = 2.0;
  constant<float>((BuiltinPrecisionTests *)&local_90,&local_34);
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_70,(ExprP<float> *)&local_80,(ExprP<float> *)&local_90)
  ;
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_c0,n,i);
  local_38 = 2.0;
  constant<float>((BuiltinPrecisionTests *)&local_d0,&local_38);
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_b0,(ExprP<float> *)&local_c0,(ExprP<float> *)&local_d0)
  ;
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_a0,n,(ExprP<float> *)&local_b0);
  alternatives<float>((BuiltinPrecisionTests *)&local_60,(ExprP<float> *)&local_70,
                      (ExprP<float> *)&local_a0);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_f0,n,n);
  local_3c = 2.0;
  constant<float>((BuiltinPrecisionTests *)&local_110,&local_3c);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_100,i,(ExprP<float> *)&local_110)
  ;
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_e0,(ExprP<float> *)&local_f0,(ExprP<float> *)&local_100
            );
  alternatives<float>((BuiltinPrecisionTests *)&local_50,(ExprP<float> *)&local_60,
                      (ExprP<float> *)&local_e0);
  BuiltinPrecisionTests::operator-((BuiltinPrecisionTests *)this,i,(ExprP<float> *)&local_50);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_50);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_e0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_100);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_110);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_f0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_60);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_a0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_b0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_d0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_c0);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_70);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_90);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_80);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_30);
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_state = extraout_RDX;
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_ptr = (Expr<float> *)this;
  return (ExprP<float>)
         EVar1.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>;
}

Assistant:

static ExprP<Ret> apply	(ExpandContext&,
							 const ExprP<Arg0>&	i,
							 const ExprP<Arg1>&	n)
	{
		return i - alternatives(alternatives((n * (n*i)) * constant(2.0f),
											n * ((n*i) * constant(2.0f))),
											(n * n) * (i * constant(2.0f)));
	}